

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiShaderResourceBindings *srb)

{
  QDebug debug;
  long lVar1;
  _func_int **pp_Var2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_50 [16];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)srb);
  *(undefined1 *)((srb->super_QRhiResource)._vptr_QRhiResource + 6) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)srb,"QRhiShaderResourceBindings(");
  local_50._0_8_ = pQVar3->stream;
  ((Stream *)local_50._0_8_)->ref = ((Stream *)local_50._0_8_)->ref + 1;
  debug.stream = (Stream *)(local_50 + 8);
  operator<<(debug,(QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)local_50);
  QDebug::operator<<((QDebug *)debug.stream,')');
  QDebug::~QDebug((QDebug *)debug.stream);
  QDebug::~QDebug((QDebug *)local_50);
  pp_Var2 = (srb->super_QRhiResource)._vptr_QRhiResource;
  (srb->super_QRhiResource)._vptr_QRhiResource = (_func_int **)0x0;
  *(_func_int ***)dbg.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiShaderResourceBindings &srb)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiShaderResourceBindings("
                  << srb.m_bindings
                  << ')';
    return dbg;
}